

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void av1_make_default_subpel_ms_params
               (SUBPEL_MOTION_SEARCH_PARAMS *ms_params,AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,
               MV *ref_mv,int *cost_list)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  byte in_CL;
  long in_RDX;
  AV1_COMP *in_RSI;
  uint *in_RDI;
  MV *in_R8;
  int *in_R9;
  MSBuffers *ms_buffers;
  SubpelMvLimits *mv_limits;
  int right_margin;
  int bottom_margin;
  int left_margin;
  int top_margin;
  AV1_COMMON *cm;
  uint in_stack_ffffffffffffff98;
  MV in_stack_ffffffffffffff9c;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined8 in_stack_ffffffffffffffa8;
  MV *in_stack_ffffffffffffffb0;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  
  *in_RDI = (uint)((in_RSI->common).features.allow_high_precision_mv & 1);
  *(SUBPEL_FORCE_STOP *)(in_RDI + 4) = (in_RSI->sf).mv_sf.subpel_force_stop;
  in_RDI[5] = (in_RSI->sf).mv_sf.subpel_iters_per_step;
  piVar3 = cond_cost_list_const(in_RSI,in_R9);
  *(int **)(in_RDI + 2) = piVar3;
  av1_set_subpel_mv_search_range
            ((SubpelMvLimits *)(in_RDI + 6),(FullMvLimits *)(in_RDX + 0x1f6e4),in_R8);
  if ((in_RSI->oxcf).algo_cfg.sharpness == 3) {
    iVar1 = *(int *)(in_RDX + 0x1a0) * 4 + 8;
    in_stack_ffffffffffffffc4 = iVar1 * 8;
    iVar2 = *(int *)(in_RDX + 0x1a4) * 4 + 8;
    in_stack_ffffffffffffffc0 = iVar2 * 8;
    in_stack_ffffffffffffffbc =
         ((in_RSI->common).height +
          (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL]
          * -4 + *(int *)(in_RDX + 0x1a0) * -4 + 8) * 8;
    in_stack_ffffffffffffffb8 =
         ((in_RSI->common).width +
          (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_CL]
          * -4 + *(int *)(in_RDX + 0x1a4) * -4 + 8) * 8;
    in_stack_ffffffffffffffb0 = (MV *)(in_RDI + 6);
    if (iVar1 * -8 < (int)in_RDI[8]) {
      in_stack_ffffffffffffffa4 = in_RDI[8];
    }
    else {
      in_stack_ffffffffffffffa4 = iVar1 * -8;
    }
    in_RDI[8] = in_stack_ffffffffffffffa4;
    in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffbc;
    if ((int)in_RDI[9] < (int)in_stack_ffffffffffffffbc) {
      in_stack_ffffffffffffffa0 = in_RDI[9];
    }
    in_RDI[9] = in_stack_ffffffffffffffa0;
    if (iVar2 * -8 < (int)*in_stack_ffffffffffffffb0) {
      in_stack_ffffffffffffff9c = *in_stack_ffffffffffffffb0;
    }
    else {
      in_stack_ffffffffffffff9c = (MV)(iVar2 * -8);
    }
    *in_stack_ffffffffffffffb0 = in_stack_ffffffffffffff9c;
    in_stack_ffffffffffffff98 = in_stack_ffffffffffffffb8;
    if ((int)in_RDI[7] < (int)in_stack_ffffffffffffffb8) {
      in_stack_ffffffffffffff98 = in_RDI[7];
    }
    in_RDI[7] = in_stack_ffffffffffffff98;
  }
  init_mv_cost_params((MV_COST_PARAMS *)
                      CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                      (MvCosts *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                      (int)in_stack_ffffffffffffffa8);
  *(aom_variance_fn_ptr_t **)(in_RDI + 0x16) = in_RSI->ppi->fn_ptr + in_CL;
  *(SUBPEL_SEARCH_TYPE *)(in_RDI + 0x18) = (in_RSI->sf).mv_sf.use_accurate_subpel_search;
  in_RDI[0x28] = (uint)block_size_wide[in_CL];
  in_RDI[0x29] = (uint)block_size_high[in_CL];
  init_ms_buffers((MSBuffers *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                  (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  return;
}

Assistant:

void av1_make_default_subpel_ms_params(SUBPEL_MOTION_SEARCH_PARAMS *ms_params,
                                       const struct AV1_COMP *cpi,
                                       const MACROBLOCK *x, BLOCK_SIZE bsize,
                                       const MV *ref_mv, const int *cost_list) {
  const AV1_COMMON *cm = &cpi->common;
  // High level params
  ms_params->allow_hp = cm->features.allow_high_precision_mv;
  ms_params->forced_stop = cpi->sf.mv_sf.subpel_force_stop;
  ms_params->iters_per_step = cpi->sf.mv_sf.subpel_iters_per_step;
  ms_params->cost_list = cond_cost_list_const(cpi, cost_list);

  av1_set_subpel_mv_search_range(&ms_params->mv_limits, &x->mv_limits, ref_mv);

  if (cpi->oxcf.algo_cfg.sharpness == 3) {
    int top_margin = GET_MV_SUBPEL(x->e_mbd.mi_row * MI_SIZE + 8);
    int left_margin = GET_MV_SUBPEL(x->e_mbd.mi_col * MI_SIZE + 8);
    int bottom_margin =
        GET_MV_SUBPEL(cpi->common.height - mi_size_high[bsize] * MI_SIZE -
                      x->e_mbd.mi_row * MI_SIZE + 8);
    int right_margin =
        GET_MV_SUBPEL(cpi->common.width - mi_size_wide[bsize] * MI_SIZE -
                      x->e_mbd.mi_col * MI_SIZE + 8);
    SubpelMvLimits *mv_limits = &ms_params->mv_limits;
    mv_limits->row_min = AOMMAX(mv_limits->row_min, -top_margin);
    mv_limits->row_max = AOMMIN(mv_limits->row_max, bottom_margin);
    mv_limits->col_min = AOMMAX(mv_limits->col_min, -left_margin);
    mv_limits->col_max = AOMMIN(mv_limits->col_max, right_margin);
  }

  // Mvcost params
  init_mv_cost_params(&ms_params->mv_cost_params, x->mv_costs, ref_mv,
                      x->errorperbit, x->sadperbit);

  // Subpel variance params
  ms_params->var_params.vfp = &cpi->ppi->fn_ptr[bsize];
  ms_params->var_params.subpel_search_type =
      cpi->sf.mv_sf.use_accurate_subpel_search;
  ms_params->var_params.w = block_size_wide[bsize];
  ms_params->var_params.h = block_size_high[bsize];

  // Ref and src buffers
  MSBuffers *ms_buffers = &ms_params->var_params.ms_buffers;
  init_ms_buffers(ms_buffers, x);
}